

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_file.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::objectivec::FileGenerator::FileGenerator
          (FileGenerator *this,FileDescriptor *file,Options *options)

{
  string *__return_storage_ptr__;
  pointer *pppEVar1;
  pointer *pppMVar2;
  pointer *pppEVar3;
  pointer pcVar4;
  iterator __position;
  iterator __position_00;
  iterator __position_01;
  MessageGenerator *pMVar5;
  long lVar6;
  FileDescriptor *pFVar7;
  long lVar8;
  EnumGenerator *generator;
  MessageGenerator *local_58;
  Options *local_50;
  vector<google::protobuf::compiler::objectivec::ExtensionGenerator*,std::allocator<google::protobuf::compiler::objectivec::ExtensionGenerator*>>
  *local_48;
  vector<google::protobuf::compiler::objectivec::MessageGenerator*,std::allocator<google::protobuf::compiler::objectivec::MessageGenerator*>>
  *local_40;
  vector<google::protobuf::compiler::objectivec::EnumGenerator*,std::allocator<google::protobuf::compiler::objectivec::EnumGenerator*>>
  *local_38;
  
  this->file_ = file;
  __return_storage_ptr__ = &this->root_class_name_;
  FileClassName_abi_cxx11_(__return_storage_ptr__,(objectivec *)file,(FileDescriptor *)options);
  local_38 = (vector<google::protobuf::compiler::objectivec::EnumGenerator*,std::allocator<google::protobuf::compiler::objectivec::EnumGenerator*>>
              *)&this->enum_generators_;
  local_40 = (vector<google::protobuf::compiler::objectivec::MessageGenerator*,std::allocator<google::protobuf::compiler::objectivec::MessageGenerator*>>
              *)&this->message_generators_;
  local_48 = (vector<google::protobuf::compiler::objectivec::ExtensionGenerator*,std::allocator<google::protobuf::compiler::objectivec::ExtensionGenerator*>>
              *)&this->extension_generators_;
  local_50 = &this->options_;
  (this->extension_generators_).
  super__Vector_base<google::protobuf::compiler::objectivec::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::ExtensionGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->extension_generators_).
  super__Vector_base<google::protobuf::compiler::objectivec::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::ExtensionGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->message_generators_).
  super__Vector_base<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->message_generators_).
  super__Vector_base<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->enum_generators_).
  super__Vector_base<google::protobuf::compiler::objectivec::EnumGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::EnumGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->message_generators_).
  super__Vector_base<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->enum_generators_).
  super__Vector_base<google::protobuf::compiler::objectivec::EnumGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::EnumGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->enum_generators_).
  super__Vector_base<google::protobuf::compiler::objectivec::EnumGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::EnumGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->extension_generators_).
  super__Vector_base<google::protobuf::compiler::objectivec::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::ExtensionGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->options_).expected_prefixes_path._M_dataplus._M_p =
       (pointer)&(this->options_).expected_prefixes_path.field_2;
  pcVar4 = (options->expected_prefixes_path)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar4,pcVar4 + (options->expected_prefixes_path)._M_string_length);
  (this->options_).generate_for_named_framework._M_dataplus._M_p =
       (pointer)&(this->options_).generate_for_named_framework.field_2;
  pcVar4 = (options->generate_for_named_framework)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->options_).generate_for_named_framework,pcVar4,
             pcVar4 + (options->generate_for_named_framework)._M_string_length);
  (this->options_).named_framework_to_proto_path_mappings_path._M_dataplus._M_p =
       (pointer)&(this->options_).named_framework_to_proto_path_mappings_path.field_2;
  pcVar4 = (options->named_framework_to_proto_path_mappings_path)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->options_).named_framework_to_proto_path_mappings_path,pcVar4,
             pcVar4 + (options->named_framework_to_proto_path_mappings_path)._M_string_length);
  pFVar7 = this->file_;
  if (0 < *(int *)(pFVar7 + 0x68)) {
    lVar6 = 0;
    lVar8 = 0;
    do {
      pMVar5 = (MessageGenerator *)operator_new(0x58);
      EnumGenerator::EnumGenerator
                ((EnumGenerator *)pMVar5,(EnumDescriptor *)(*(long *)(pFVar7 + 0x70) + lVar6));
      __position._M_current =
           (this->enum_generators_).
           super__Vector_base<google::protobuf::compiler::objectivec::EnumGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::EnumGenerator_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_58 = pMVar5;
      if (__position._M_current ==
          (this->enum_generators_).
          super__Vector_base<google::protobuf::compiler::objectivec::EnumGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::EnumGenerator_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<google::protobuf::compiler::objectivec::EnumGenerator*,std::allocator<google::protobuf::compiler::objectivec::EnumGenerator*>>
        ::_M_realloc_insert<google::protobuf::compiler::objectivec::EnumGenerator*const&>
                  (local_38,__position,(EnumGenerator **)&local_58);
      }
      else {
        *__position._M_current = (EnumGenerator *)pMVar5;
        pppEVar1 = &(this->enum_generators_).
                    super__Vector_base<google::protobuf::compiler::objectivec::EnumGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::EnumGenerator_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppEVar1 = *pppEVar1 + 1;
      }
      lVar8 = lVar8 + 1;
      pFVar7 = this->file_;
      lVar6 = lVar6 + 0x38;
    } while (lVar8 < *(int *)(pFVar7 + 0x68));
  }
  pFVar7 = this->file_;
  if (0 < *(int *)(pFVar7 + 0x58)) {
    lVar6 = 0;
    lVar8 = 0;
    do {
      pMVar5 = (MessageGenerator *)operator_new(0xe0);
      MessageGenerator::MessageGenerator
                (pMVar5,__return_storage_ptr__,(Descriptor *)(*(long *)(pFVar7 + 0x60) + lVar6),
                 local_50);
      __position_00._M_current =
           (this->message_generators_).
           super__Vector_base<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_58 = pMVar5;
      if (__position_00._M_current ==
          (this->message_generators_).
          super__Vector_base<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<google::protobuf::compiler::objectivec::MessageGenerator*,std::allocator<google::protobuf::compiler::objectivec::MessageGenerator*>>
        ::_M_realloc_insert<google::protobuf::compiler::objectivec::MessageGenerator*const&>
                  (local_40,__position_00,&local_58);
      }
      else {
        *__position_00._M_current = pMVar5;
        pppMVar2 = &(this->message_generators_).
                    super__Vector_base<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppMVar2 = *pppMVar2 + 1;
      }
      lVar8 = lVar8 + 1;
      pFVar7 = this->file_;
      lVar6 = lVar6 + 0xa8;
    } while (lVar8 < *(int *)(pFVar7 + 0x58));
  }
  pFVar7 = this->file_;
  if (0 < *(int *)(pFVar7 + 0x88)) {
    lVar6 = 0;
    lVar8 = 0;
    do {
      pMVar5 = (MessageGenerator *)operator_new(0x48);
      ExtensionGenerator::ExtensionGenerator
                ((ExtensionGenerator *)pMVar5,__return_storage_ptr__,
                 (FieldDescriptor *)(*(long *)(pFVar7 + 0x98) + lVar6));
      __position_01._M_current =
           (this->extension_generators_).
           super__Vector_base<google::protobuf::compiler::objectivec::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::ExtensionGenerator_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_58 = pMVar5;
      if (__position_01._M_current ==
          (this->extension_generators_).
          super__Vector_base<google::protobuf::compiler::objectivec::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::ExtensionGenerator_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<google::protobuf::compiler::objectivec::ExtensionGenerator*,std::allocator<google::protobuf::compiler::objectivec::ExtensionGenerator*>>
        ::_M_realloc_insert<google::protobuf::compiler::objectivec::ExtensionGenerator*const&>
                  (local_48,__position_01,(ExtensionGenerator **)&local_58);
      }
      else {
        *__position_01._M_current = (ExtensionGenerator *)pMVar5;
        pppEVar3 = &(this->extension_generators_).
                    super__Vector_base<google::protobuf::compiler::objectivec::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::ExtensionGenerator_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppEVar3 = *pppEVar3 + 1;
      }
      lVar8 = lVar8 + 1;
      pFVar7 = this->file_;
      lVar6 = lVar6 + 0xa8;
    } while (lVar8 < *(int *)(pFVar7 + 0x88));
  }
  return;
}

Assistant:

FileGenerator::FileGenerator(const FileDescriptor *file, const Options& options)
    : file_(file),
      root_class_name_(FileClassName(file)),
      options_(options) {
  for (int i = 0; i < file_->enum_type_count(); i++) {
    EnumGenerator *generator = new EnumGenerator(file_->enum_type(i));
    enum_generators_.push_back(generator);
  }
  for (int i = 0; i < file_->message_type_count(); i++) {
    MessageGenerator *generator =
        new MessageGenerator(root_class_name_, file_->message_type(i), options_);
    message_generators_.push_back(generator);
  }
  for (int i = 0; i < file_->extension_count(); i++) {
    ExtensionGenerator *generator =
        new ExtensionGenerator(root_class_name_, file_->extension(i));
    extension_generators_.push_back(generator);
  }
}